

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source.cc
# Opt level: O2

Result __thiscall wabt::LexerSourceFile::Tell(LexerSourceFile *this,Offset *out_offset)

{
  Offset OVar1;
  Enum EVar2;
  
  EVar2 = Error;
  if ((FILE *)this->file_ != (FILE *)0x0) {
    OVar1 = ftell((FILE *)this->file_);
    if (-1 < (long)OVar1) {
      *out_offset = OVar1;
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result LexerSourceFile::Tell(Offset* out_offset) {
  if (!file_) {
    return Result::Error;
  }

  long offset = ftell(file_);
  if (offset < 0) {
    return Result::Error;
  }

  *out_offset = offset;
  return Result::Ok;
}